

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O0

void __thiscall
FastPForLib::FastPForImpl<4U,_unsigned_long>::getBestBFromData
          (FastPForImpl<4U,_unsigned_long> *this,unsigned_long *in,uint8_t *bestb,
          uint8_t *bestcexcept,uint8_t *maxb)

{
  uint uVar1;
  uint32_t uVar2;
  undefined1 *in_RCX;
  byte *in_RDX;
  long in_RSI;
  byte *in_R8;
  uint32_t thiscost;
  uint32_t b;
  uint32_t cexcept;
  uint32_t bestcost;
  uint32_t k_1;
  uint32_t k;
  uint32_t freqs [65];
  uint8_t bits;
  uint local_150;
  uint local_14c;
  int local_148;
  uint local_144;
  uint local_140;
  uint local_13c;
  int aiStack_138 [67];
  byte local_29;
  byte *local_28;
  undefined1 *local_20;
  byte *local_18;
  long local_10;
  
  local_29 = 0x40;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_13c = 0; local_13c <= local_29; local_13c = local_13c + 1) {
    aiStack_138[local_13c] = 0;
  }
  for (local_140 = 0; local_140 < 0x80; local_140 = local_140 + 1) {
    uVar2 = asmbits(*(uint64_t *)(local_10 + (ulong)local_140 * 8));
    aiStack_138[uVar2] = aiStack_138[uVar2] + 1;
  }
  *local_18 = local_29;
  while (aiStack_138[*local_18] == 0) {
    *local_18 = *local_18 - 1;
  }
  *local_28 = *local_18;
  local_144 = (uint)*local_18 << 7;
  local_148 = 0;
  *local_20 = 0;
  uVar1 = (uint)*local_18;
  while (local_14c = uVar1 - 1, local_14c < local_29) {
    local_148 = aiStack_138[uVar1] + local_148;
    local_150 = local_148 * 8 + local_148 * (*local_28 - local_14c) + local_14c * 0x80 + 8;
    if (*local_28 - local_14c == 1) {
      local_150 = local_150 - local_148;
    }
    uVar1 = local_14c;
    if (local_150 < local_144) {
      local_144 = local_150;
      *local_18 = (byte)local_14c;
      *local_20 = (char)local_148;
    }
  }
  return;
}

Assistant:

void getBestBFromData(const IntType *in, uint8_t &bestb, uint8_t &bestcexcept,
                        uint8_t &maxb) {
    uint8_t bits = sizeof(IntType) * 8;
    uint32_t freqs[65];
    for (uint32_t k = 0; k <= bits; ++k) freqs[k] = 0;
    for (uint32_t k = 0; k < BlockSize; ++k) {
      freqs[asmbits(in[k])]++;
    }
    bestb = bits;
    while (freqs[bestb] == 0) bestb--;
    maxb = bestb;
    uint32_t bestcost = bestb * BlockSize;
    uint32_t cexcept = 0;
    bestcexcept = static_cast<uint8_t>(cexcept);
    for (uint32_t b = bestb - 1; b < bits; --b) {
      cexcept += freqs[b + 1];
      uint32_t thiscost = cexcept * overheadofeachexcept +
                          cexcept * (maxb - b) + b * BlockSize +
                          8;  // the  extra 8 is the cost of storing maxbits
      if (maxb - b == 1) thiscost -= cexcept;
      if (thiscost < bestcost) {
        bestcost = thiscost;
        bestb = static_cast<uint8_t>(b);
        bestcexcept = static_cast<uint8_t>(cexcept);
      }
    }
  }